

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastGen.hpp
# Opt level: O3

QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Lhs> *
__thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::FastGeneralizationsIterator::next
          (QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Lhs>
           *__return_storage_ptr__,FastGeneralizationsIterator *this)

{
  Renaming *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  TermList t;
  ResultSubstitution *pRVar3;
  RefCounter *pRVar4;
  TypedTermList TVar5;
  
  do {
    iVar2 = (*((this->_ldIterator)._core)->_vptr_IteratorCore[2])();
    if ((char)iVar2 != '\0') break;
    bVar1 = findNextLeaf(this);
  } while (bVar1);
  iVar2 = (*((this->_ldIterator)._core)->_vptr_IteratorCore[3])();
  if (this->_retrieveSubstitution == true) {
    this_00 = &this->_resultNormalizer;
    Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::reset
              (&this_00->_data);
    (this->_resultNormalizer)._nextVar = 0;
    (this->_resultNormalizer)._identity = true;
    TVar5 = Kernel::SelectedEquality::biggerSide((SelectedEquality *)CONCAT44(extraout_var,iVar2));
    t = Kernel::SortHelper::getResultSort(TVar5.super_TermList._content._content);
    Kernel::Renaming::normalizeVariables(this_00,TVar5.super_TermList._content);
    Kernel::Renaming::normalizeVariables(this_00,t);
    pRVar3 = (ResultSubstitution *)
             Lib::FixedSizeAllocator<32UL>::alloc
                       ((FixedSizeAllocator<32UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    pRVar3->_vptr_ResultSubstitution = (_func_int **)&PTR__Substitution_00b2a590;
    pRVar3[1]._vptr_ResultSubstitution = (_func_int **)&this->_subst;
    pRVar3[2]._vptr_ResultSubstitution = (_func_int **)this_00;
    pRVar3[3]._vptr_ResultSubstitution = (_func_int **)0x0;
    pRVar4 = (RefCounter *)
             Lib::FixedSizeAllocator<8UL>::alloc
                       ((FixedSizeAllocator<8UL> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR);
    pRVar4->_val = 1;
  }
  else {
    pRVar3 = (ResultSubstitution *)0x0;
    pRVar4 = (RefCounter *)0x0;
  }
  (__return_storage_ptr__->unifier)._obj = pRVar3;
  (__return_storage_ptr__->unifier)._refCnt = pRVar4;
  __return_storage_ptr__->data = (Lhs *)CONCAT44(extraout_var,iVar2);
  return __return_storage_ptr__;
}

Assistant:

QueryRes<ResultSubstitutionSP, LeafData_> SubstitutionTree<LeafData_>::FastGeneralizationsIterator::next()
{
  while(!_ldIterator.hasNext() && findNextLeaf()) {}
  ASS(_ldIterator.hasNext());
  auto ld = _ldIterator.next();

  if(_retrieveSubstitution) {
    _resultNormalizer.reset();
    _resultNormalizer.normalizeVariables(ld->key());

    return QueryRes(_subst.getSubstitution(&_resultNormalizer),ld);
  } else {
    return QueryRes(ResultSubstitutionSP(), ld);
  }
}